

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_engine.cpp
# Opt level: O2

uint64_t __thiscall duckdb::RandomEngine::NextRandomInteger64(RandomEngine *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  
  uVar1 = NextRandomInteger(this);
  uVar2 = NextRandomInteger(this);
  return CONCAT44(uVar1,uVar2);
}

Assistant:

uint64_t RandomEngine::NextRandomInteger64() {
	return (static_cast<uint64_t>(NextRandomInteger()) << UINT64_C(32)) | static_cast<uint64_t>(NextRandomInteger());
}